

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryHelpers.hpp
# Opt level: O0

string * generateStringVector_if<gmlc::libguarded::shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,helics::InterfaceHandle,(reference_stability)0,5>,std::shared_mutex>,helics::MessageFederateManager::localQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__0,helics::MessageFederateManager::localQuery[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__1>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_1,
                   undefined8 param_2)

{
  undefined1 uVar1;
  size_type sVar2;
  reference pvVar3;
  Endpoint *ele;
  const_iterator __end0;
  const_iterator __begin0;
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *__range1;
  string *ret;
  Endpoint *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  Endpoint *in_stack_ffffffffffffff28;
  char __c;
  undefined7 in_stack_ffffffffffffff30;
  string *string;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> local_68;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> local_50 [2];
  undefined1 local_19;
  undefined8 local_18;
  undefined8 local_8;
  
  local_19 = 0;
  string = (string *)&stack0xffffffffffffffe6;
  local_18 = param_2;
  local_8 = param_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe6);
  local_50[1].vec = (Endpoint **)local_18;
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::begin((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
           *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::end((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
         *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  while( true ) {
    __c = (char)((ulong)in_stack_ffffffffffffff28 >> 0x38);
    uVar1 = gmlc::containers::
            BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*>::operator!=
                      (local_50,&local_68);
    if (!(bool)uVar1) break;
    in_stack_ffffffffffffff28 =
         gmlc::containers::
         BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*>::operator*
                   (local_50);
    in_stack_ffffffffffffff27 =
         const::$_1::operator()
                   ((anon_class_1_0_00000001 *)
                    CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff18);
    if ((bool)in_stack_ffffffffffffff27) {
      const::$_0::operator()
                ((anon_class_1_0_00000001 *)in_stack_ffffffffffffff28,
                 (Endpoint *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      helics::generateJsonQuotedString(string);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff30),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff28);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(uVar1,in_stack_ffffffffffffff30),
                (char)((ulong)in_stack_ffffffffffffff28 >> 0x38));
    }
    gmlc::containers::BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*>::
    operator++((BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> *)
               CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  }
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (param_1);
  if (sVar2 < 2) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar1,in_stack_ffffffffffffff30),__c);
  }
  else {
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    *pvVar3 = ']';
  }
  return param_1;
}

Assistant:

std::string generateStringVector_if(const X& data, Proc generator, validator valid)
{
    static_assert(std::is_convertible<decltype(generator(*(data.begin()))), std::string>::value,
                  "generator output must be convertible to std::string");
    std::string ret{"["};
    for (auto& ele : data) {
        if (valid(ele)) {
            ret.append(helics::generateJsonQuotedString(generator(ele)));
            ret.push_back(',');
        }
    }
    if (ret.size() > 1) {
        ret.back() = ']';
    } else {
        ret.push_back(']');
    }
    return ret;
}